

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_kv_functional_test.cc
# Opt level: O2

void multi_kv_open_test(void)

{
  fdb_status fVar1;
  uint uVar2;
  char *__format;
  int i;
  long lVar3;
  fdb_file_handle *dbfile;
  fdb_kvs_handle *db;
  char kvname [8];
  timeval __test_begin;
  fdb_file_handle *local_198;
  fdb_kvs_handle *local_190;
  char local_188 [8];
  fdb_kvs_config local_180;
  timeval local_168;
  pthread_t apStack_158 [7];
  fdb_config local_120;
  
  gettimeofday(&local_168,(__timezone_ptr_t)0x0);
  memleak_start();
  system("rm -rf  multi_kv_test* > errorlog.txt");
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  fVar1 = fdb_open(&local_198,"multi_kv_test2",&local_120);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
            ,0x94d);
    multi_kv_open_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                  ,0x94d,"void multi_kv_open_test()");
  }
  for (lVar3 = 0; lVar3 != 0x38; lVar3 = lVar3 + 8) {
    pthread_create((pthread_t *)((long)apStack_158 + lVar3),(pthread_attr_t *)0x0,_opening_thread,
                   (void *)0x0);
  }
  for (uVar2 = 0; uVar2 != 0x100; uVar2 = uVar2 + 1) {
    sprintf(local_188,"kv_%d",(ulong)uVar2);
    fVar1 = fdb_kvs_open(local_198,&local_190,local_188,&local_180);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
              ,0x957);
      multi_kv_open_test()::__test_pass = 1;
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                    ,0x957,"void multi_kv_open_test()");
    }
  }
  for (lVar3 = 0; lVar3 != 7; lVar3 = lVar3 + 1) {
    pthread_join(apStack_158[lVar3],&local_190);
  }
  fVar1 = fdb_close(local_198);
  if (fVar1 == FDB_RESULT_SUCCESS) {
    fVar1 = fdb_shutdown();
    if (fVar1 == FDB_RESULT_SUCCESS) {
      memleak_end();
      __format = "%s PASSED\n";
      if (multi_kv_open_test()::__test_pass != '\0') {
        __format = "%s FAILED\n";
      }
      fprintf(_stderr,__format,"multi KV creation with parallel open");
      return;
    }
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
            ,0x962);
    multi_kv_open_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                  ,0x962,"void multi_kv_open_test()");
  }
  fprintf(_stderr,"Test failed: %s %d\n",
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
          ,0x960);
  multi_kv_open_test()::__test_pass = 1;
  __assert_fail("status == FDB_RESULT_SUCCESS",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                ,0x960,"void multi_kv_open_test()");
}

Assistant:

void multi_kv_open_test()
{
    TEST_INIT();
    memleak_start();

    int n = 256;
    int nthreads = 7;
    thread_t *tid = alca(thread_t, nthreads);
    fdb_file_handle *dbfile;
    fdb_status status;
    fdb_config fconfig;
    fdb_kvs_config kvs_config;

    // remove previous multi_kv_test files
    int r = system(SHELL_DEL" multi_kv_test* > errorlog.txt");
    (void)r;

    fconfig = fdb_get_default_config();
    kvs_config = fdb_get_default_kvs_config();

    // open db
    status = fdb_open(&dbfile, "multi_kv_test2", &fconfig);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    for (int i = 0; i < nthreads; ++i) {
        thread_create(&tid[i], _opening_thread, NULL);
    }
    for (int i = 0; i < n; ++i) {
        fdb_kvs_handle *db;
        char kvname[8];
        sprintf(kvname, "kv_%d", i);
        status = fdb_kvs_open(dbfile, &db, kvname, &kvs_config);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    }

    for (int i = 0; i < nthreads; ++i) {
        void *thread_ret;
        thread_join(tid[i], &thread_ret);
    }

    status = fdb_close(dbfile);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_shutdown();
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    memleak_end();
    TEST_RESULT("multi KV creation with parallel open");
}